

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O1

DataDrawerBase * __thiscall SVGChart::LineDataDrawer::Clone(LineDataDrawer *this)

{
  pointer pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  undefined3 uVar9;
  DataDrawerBase *pDVar10;
  
  pDVar10 = (DataDrawerBase *)operator_new(0xa8);
  pDVar10->_vptr_DataDrawerBase = (_func_int **)&PTR__DataDrawerBase_00112b80;
  uVar2 = *(undefined4 *)((long)&(this->super_DataDrawerBase).mXTrafo + 4);
  uVar3 = *(undefined4 *)&(this->super_DataDrawerBase).mYTrafo;
  uVar4 = *(undefined4 *)((long)&(this->super_DataDrawerBase).mYTrafo + 4);
  uVar5 = *(undefined4 *)((long)&(this->super_DataDrawerBase).mYTrafo + 4);
  bVar8 = (this->super_DataDrawerBase).mDrawFast;
  uVar9 = *(undefined3 *)&(this->super_DataDrawerBase).field_0x19;
  iVar6 = (this->super_DataDrawerBase).mPlotCount;
  iVar7 = (this->super_DataDrawerBase).mPlotIndex;
  *(undefined4 *)&pDVar10->mXTrafo = *(undefined4 *)&(this->super_DataDrawerBase).mXTrafo;
  *(undefined4 *)((long)&pDVar10->mXTrafo + 4) = uVar2;
  *(undefined4 *)&pDVar10->mYTrafo = uVar3;
  *(undefined4 *)((long)&pDVar10->mYTrafo + 4) = uVar4;
  *(undefined4 *)((long)&pDVar10->mYTrafo + 4) = uVar5;
  pDVar10->mDrawFast = bVar8;
  *(undefined3 *)&pDVar10->field_0x19 = uVar9;
  pDVar10->mPlotCount = iVar6;
  pDVar10->mPlotIndex = iVar7;
  pDVar10->_vptr_DataDrawerBase = (_func_int **)&PTR__LineDataDrawer_00112818;
  *(undefined2 *)&pDVar10->field_0x24 = *(undefined2 *)&(this->super_DataDrawerBase).field_0x24;
  *(int *)&pDVar10[1]._vptr_DataDrawerBase = (this->mStyle).mFontSize;
  pDVar10[1].mXTrafo = (Trafo *)&pDVar10[1].mDrawFast;
  pcVar1 = (this->mStyle).mFont._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pDVar10[1].mXTrafo,pcVar1,pcVar1 + (this->mStyle).mFont._M_string_length);
  *(int *)&pDVar10[2]._vptr_DataDrawerBase = (this->mStyle).mPenWidth;
  pDVar10[2].mXTrafo = (Trafo *)&pDVar10[2].mDrawFast;
  pcVar1 = (this->mStyle).mPenStyle._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pDVar10[2].mXTrafo,pcVar1,pcVar1 + (this->mStyle).mPenStyle._M_string_length
            );
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(pDVar10 + 3),&(this->mStyle).mVar._M_t);
  return pDVar10;
}

Assistant:

DataDrawerBase* LineDataDrawer::Clone () const {
        return new LineDataDrawer (*this);
    }